

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_number.hpp
# Opt level: O0

Boxed_Value
chaiscript::Boxed_Number::binary_go<int,long_double>
          (Opers t_oper,int *t,longdouble *u,Boxed_Value *t_lhs)

{
  longdouble lVar1;
  bad_any_cast *this;
  longdouble *in_RCX;
  int *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined4 in_ESI;
  element_type *in_RDI;
  Boxed_Value BVar2;
  Boxed_Value *in_stack_ffffffffffffff68;
  undefined2 in_stack_ffffffffffffff70;
  undefined6 in_stack_ffffffffffffff72;
  
  switch(in_ESI) {
  case 8:
    *in_RDX = (int)ROUND(*in_RCX);
    break;
  default:
    this = (bad_any_cast *)__cxa_allocate_exception(0x28);
    chaiscript::detail::exception::bad_any_cast::bad_any_cast(this);
    __cxa_throw(this,&chaiscript::detail::exception::bad_any_cast::typeinfo,
                chaiscript::detail::exception::bad_any_cast::~bad_any_cast);
  case 0xb:
    *in_RDX = (int)ROUND((longdouble)*in_RDX * *in_RCX);
    break;
  case 0xc:
    *in_RDX = (int)ROUND((longdouble)*in_RDX + *in_RCX);
    break;
  case 0xd:
    lVar1 = *in_RCX;
    in_stack_ffffffffffffff68 = SUB108(lVar1,0);
    in_stack_ffffffffffffff70 = (undefined2)((unkuint10)lVar1 >> 0x40);
    check_divide_by_zero<long_double>(lVar1,(type *)0x0);
    *in_RDX = (int)ROUND((longdouble)*in_RDX / *in_RCX);
    break;
  case 0xe:
    *in_RDX = (int)ROUND((longdouble)*in_RDX - *in_RCX);
  }
  Boxed_Value::Boxed_Value
            ((Boxed_Value *)CONCAT62(in_stack_ffffffffffffff72,in_stack_ffffffffffffff70),
             in_stack_ffffffffffffff68);
  BVar2.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  BVar2.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = in_RDI;
  return (Boxed_Value)
         BVar2.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static Boxed_Value binary_go(Operators::Opers t_oper, T &t, const U &u, const Boxed_Value &t_lhs) 
      {
        switch (t_oper)
        {
          case Operators::assign:
            t = u;
            break;
          case Operators::assign_product:
            t *= u;
            break;
          case Operators::assign_sum:
            t += u;
            break;
          case Operators::assign_quotient:
            check_divide_by_zero(u);
            t /= u;
            break;
          case Operators::assign_difference:
            t -= u;
            break;
          default:
            throw chaiscript::detail::exception::bad_any_cast();
        }

        return t_lhs;
      }